

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

exr_result_t exr_attr_string_init(exr_context_t ctxt,exr_attr_string_t *s,int32_t len)

{
  exr_result_t eVar1;
  char *pcVar2;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (len < 0) {
      eVar1 = (*ctxt->print_error)
                        (ctxt,3,"Received request to allocate negative sized string (%d)",
                         (ulong)(uint)len,ctxt->print_error);
      return eVar1;
    }
    if (s == (exr_attr_string_t *)0x0) {
      eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid reference to string object to initialize");
      return eVar1;
    }
    s->length = 0;
    s->alloc_size = 0;
    s->str = (char *)0x0;
    pcVar2 = (char *)(*ctxt->alloc_fn)((ulong)(len + 1U));
    s->str = pcVar2;
    if (pcVar2 == (char *)0x0) {
      eVar1 = (*ctxt->standard_error)(ctxt,1);
      return eVar1;
    }
    s->length = len;
    s->alloc_size = len + 1U;
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_init (exr_context_t ctxt, exr_attr_string_t* s, int32_t len)
{
    exr_attr_string_t nil = {0};
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (len < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized string (%d)",
            len);

    if (!s)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string object to initialize");

    *s     = nil;
    s->str = (char*) ctxt->alloc_fn ((size_t) (len + 1));
    if (s->str == NULL)
        return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
    s->length     = len;
    s->alloc_size = len + 1;
    return EXR_ERR_SUCCESS;
}